

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_peobj.c
# Opt level: O0

void emit_peobj_sym_sect(BuildCtx *ctx,PEsection *pesect,int sect)

{
  uint32_t local_44;
  uint16_t local_40;
  PEsymaux aux;
  PEsym sym;
  int sect_local;
  PEsection *pesect_local;
  BuildCtx *ctx_local;
  
  if (strtab != (char *)0x0) {
    aux._12_8_ = *(undefined8 *)pesect[sect].name;
    owrite(ctx,&aux.assoc,0x12);
    memset(&local_44,0,0x14);
    local_44 = pesect[sect].size;
    local_40 = pesect[sect].nreloc;
    owrite(ctx,&local_44,0x12);
  }
  return;
}

Assistant:

static void emit_peobj_sym_sect(BuildCtx *ctx, PEsection *pesect, int sect)
{
  PEsym sym;
  PEsymaux aux;
  if (!strtab) return;  /* Pass 1: no output. */
  memcpy(sym.n.name, pesect[sect].name, 8);
  sym.value = 0;
  sym.sect = (int16_t)(sect+1);  /* 1-based section number. */
  sym.type = PEOBJ_TYPE_NULL;
  sym.scl = PEOBJ_SCL_STATIC;
  sym.naux = 1;
  owrite(ctx, &sym, PEOBJ_SYM_SIZE);
  memset(&aux, 0, sizeof(PEsymaux));
  aux.size = pesect[sect].size;
  aux.nreloc = pesect[sect].nreloc;
  owrite(ctx, &aux, PEOBJ_SYM_SIZE);
}